

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall t_st_generator::generate_recv_method(t_st_generator *this,t_function *function)

{
  ofstream_with_content_based_conditional_update *out;
  t_program *program;
  t_type *ptVar1;
  t_struct *ptVar2;
  t_field *this_00;
  ostream *poVar3;
  pointer pptVar4;
  string funname;
  string signature;
  t_field success;
  t_struct result;
  allocator local_3c9;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  t_field local_1a8;
  t_struct local_f8;
  
  std::__cxx11::string::string((string *)&local_1c8,(string *)&function->name_);
  t_generator::camelcase(&local_3a8,(t_generator *)this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  function_signature_abi_cxx11_(&local_208,this,function);
  program = (this->super_t_oop_generator).super_t_generator.program_;
  std::__cxx11::string::string((string *)&local_1a8,"TResult",(allocator *)&local_3c8);
  t_struct::t_struct(&local_f8,program,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  ptVar1 = function->returntype_;
  std::__cxx11::string::string((string *)&local_228,"success",(allocator *)&local_3c8);
  t_field::t_field(&local_1a8,ptVar1,&local_228,0);
  std::__cxx11::string::~string((string *)&local_228);
  t_struct::append(&local_f8,&local_1a8);
  ptVar2 = function->xceptions_;
  for (pptVar4 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    this_00 = (t_field *)operator_new(0xb0);
    ptVar1 = (*pptVar4)->type_;
    std::__cxx11::string::string((string *)&local_1e8,"exception",(allocator *)&local_3c8);
    t_field::t_field(this_00,ptVar1,&local_1e8,(*pptVar4)->key_);
    std::__cxx11::string::~string((string *)&local_1e8);
    t_struct::append(&local_f8,this_00);
  }
  client_class_name_abi_cxx11_(&local_248,this);
  std::__cxx11::string::string((string *)&local_288,(string *)&local_3a8);
  t_generator::capitalize(&local_3c8,(t_generator *)this,&local_288);
  std::operator+(&local_268,"recv",&local_3c8);
  out = &this->f_;
  st_method(this,(ostream *)out,&local_248,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_248);
  poVar3 = std::operator<<((ostream *)out,"| f msg res | ");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_3c8);
  poVar3 = std::operator<<(poVar3,"msg := oprot readMessageBegin.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
  poVar3 = std::operator<<(poVar3,"self validateRemoteMessage: msg.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2c8);
  poVar3 = std::operator<<(poVar3,"res := ");
  std::__cxx11::string::string((string *)&local_308,"",&local_3c9);
  struct_reader(&local_2e8,this,&local_f8,&local_308);
  poVar3 = std::operator<<(poVar3,(string *)&local_2e8);
  poVar3 = std::operator<<(poVar3,".");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_328,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_328);
  poVar3 = std::operator<<(poVar3,"oprot readMessageEnd.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_348);
  poVar3 = std::operator<<(poVar3,"oprot transport flush.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_368,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_368);
  poVar3 = std::operator<<(poVar3,"res exception ifNotNil: [res exception signal].");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_388,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_388);
  std::operator<<(poVar3,"^ res");
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  st_close_method(this,(ostream *)out);
  t_field::~t_field(&local_1a8);
  t_struct::~t_struct(&local_f8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_3a8);
  return;
}

Assistant:

void t_st_generator::generate_recv_method(t_function* function) {
  string funname = camelcase(function->get_name());
  string signature = function_signature(function);

  t_struct result(program_, "TResult");
  t_field success(function->get_returntype(), "success", 0);
  result.append(&success);

  t_struct* xs = function->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    // duplicate the field, but call it "exception"... we don't need a dynamic name
    t_field* exception = new t_field((*f_iter)->get_type(), "exception", (*f_iter)->get_key());
    result.append(exception);
  }

  st_method(f_, client_class_name(), "recv" + capitalize(funname));
  f_ << "| f msg res | " << endl << indent() << "msg := oprot readMessageBegin." << endl << indent()
     << "self validateRemoteMessage: msg." << endl << indent()
     << "res := " << struct_reader(&result) << "." << endl << indent() << "oprot readMessageEnd."
     << endl << indent() << "oprot transport flush." << endl << indent()
     << "res exception ifNotNil: [res exception signal]." << endl << indent() << "^ res";
  st_close_method(f_);
}